

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree.h
# Opt level: O1

node_type * __thiscall
st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
          (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *this)

{
  exception *this_00;
  string local_38;
  
  if (this->_root != (node_type *)0x0) {
    return this->_root;
  }
  this_00 = (exception *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"root(): empty tree has no root node","");
  exception::exception(this_00,&local_38);
  *(undefined ***)this_00 = &PTR__exception_0030e0b0;
  __cxa_throw(this_00,&empty_exception::typeinfo,exception::~exception);
}

Assistant:

bool empty() const { return _root == NULL; }